

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void CopyPlayer(player_t *dst,player_t *src,char *name)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  FPlayerSkin *pFVar4;
  bool bVar5;
  int iVar6;
  DPSprite *local_78;
  DPSprite *pspr;
  botinfo_t *thebot;
  bool usedown;
  bool attackdown;
  int chasecam;
  undefined1 local_50 [8];
  userinfo_t uibackup2;
  userinfo_t uibackup;
  char *name_local;
  player_t *src_local;
  player_t *dst_local;
  
  userinfo_t::userinfo_t
            ((userinfo_t *)
             &uibackup2.
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size);
  userinfo_t::userinfo_t((userinfo_t *)local_50);
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
            ((TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)
             &uibackup2.
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size,
             &(dst->userinfo).
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>);
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
            ((TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)local_50,
             &(src->userinfo).
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>);
  uVar3 = dst->cheats;
  bVar1 = dst->attackdown;
  bVar2 = dst->usedown;
  player_t::operator=(dst,src);
  dst->cheats = uVar3 & 0x20 | dst->cheats;
  bVar5 = TObjPtr<DBot>::operator!=(&dst->Bot,(DBot *)0x0);
  if (bVar5) {
    pspr = (DPSprite *)bglobal.botinfo;
    while( true ) {
      bVar5 = false;
      if (pspr != (DPSprite *)0x0) {
        iVar6 = strcasecmp(name,(char *)(pspr->super_DObject).Class);
        bVar5 = iVar6 != 0;
      }
      if (!bVar5) break;
      pspr = (DPSprite *)(pspr->super_DObject)._vptr_DObject;
    }
    if (pspr != (DPSprite *)0x0) {
      *(undefined4 *)&pspr->x = 2;
    }
    bglobal.botnum = bglobal.botnum + 1;
    TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
              (&(dst->userinfo).
                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,
               (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)local_50)
    ;
  }
  else {
    TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
              (&(dst->userinfo).
                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,
               (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)
               &uibackup2.
                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size)
    ;
  }
  pFVar4 = skins;
  iVar6 = userinfo_t::GetSkin(&dst->userinfo);
  iVar6 = R_FindSkin(pFVar4[iVar6].name,(uint)dst->CurrentPlayerClass);
  userinfo_t::SkinNumChanged(&dst->userinfo,iVar6);
  if (dst->mo != (APlayerPawn *)0x0) {
    (dst->mo->super_AActor).player = dst;
  }
  for (local_78 = TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&dst->psprites);
      local_78 != (DPSprite *)0x0;
      local_78 = TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&local_78->Next)) {
    local_78->Owner = dst;
  }
  TObjPtr<DPSprite>::operator=(&src->psprites,(DPSprite *)0x0);
  dst->attackdown = (bool)(bVar1 & 1);
  dst->usedown = (bool)(bVar2 & 1);
  userinfo_t::~userinfo_t((userinfo_t *)local_50);
  userinfo_t::~userinfo_t
            ((userinfo_t *)
             &uibackup2.
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size);
  return;
}

Assistant:

void CopyPlayer(player_t *dst, player_t *src, const char *name)
{
	// The userinfo needs to be saved for real players, but it
	// needs to come from the save for bots.
	userinfo_t uibackup;
	userinfo_t uibackup2;

	uibackup.TransferFrom(dst->userinfo);
	uibackup2.TransferFrom(src->userinfo);

	int chasecam = dst->cheats & CF_CHASECAM;	// Remember the chasecam setting
	bool attackdown = dst->attackdown;
	bool usedown = dst->usedown;


	*dst = *src;		// To avoid memory leaks at this point the userinfo in src must be empty which is taken care of by the TransferFrom call above.

	dst->cheats |= chasecam;

	if (dst->Bot != nullptr)
	{
		botinfo_t *thebot = bglobal.botinfo;
		while (thebot && stricmp(name, thebot->name))
		{
			thebot = thebot->next;
		}
		if (thebot)
		{
			thebot->inuse = BOTINUSE_Yes;
		}
		bglobal.botnum++;
		dst->userinfo.TransferFrom(uibackup2);
	}
	else
	{
		dst->userinfo.TransferFrom(uibackup);
	}
	// Validate the skin
	dst->userinfo.SkinNumChanged(R_FindSkin(skins[dst->userinfo.GetSkin()].name, dst->CurrentPlayerClass));

	// Make sure the player pawn points to the proper player struct.
	if (dst->mo != nullptr)
	{
		dst->mo->player = dst;
	}

	// Same for the psprites.
	DPSprite *pspr = dst->psprites;
	while (pspr)
	{
		pspr->Owner = dst;

		pspr = pspr->Next;
	}

	// Don't let the psprites be destroyed when src is destroyed.
	src->psprites = nullptr;

	// These 2 variables may not be overwritten.
	dst->attackdown = attackdown;
	dst->usedown = usedown;
}